

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# onesided.c
# Opt level: O2

void pnga_access_block_grid_ptr(Integer g_a,Integer *index,void *ptr,Integer *ld)

{
  global_array_t *pgVar1;
  global_array_t *pgVar2;
  int iVar3;
  long lVar4;
  global_array_t *pgVar5;
  global_array_t *pgVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  global_array_t *pgVar10;
  long lVar11;
  long lVar12;
  C_Integer *pCVar13;
  global_array_t *pgVar14;
  long lVar15;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  Integer _ndim;
  C_Integer *pCVar19;
  C_Integer CVar20;
  long lVar21;
  ulong uVar22;
  long lVar23;
  C_Integer *pCVar24;
  long lVar25;
  ulong uVar26;
  Integer proc_index [7];
  Integer lld [7];
  Integer ldims [7];
  Integer ldidx [7];
  Integer block_idx [7];
  Integer block_count [7];
  
  lVar25 = g_a + 1000;
  pgVar10 = (global_array_t *)index;
  if (2 < GA[g_a + 1000].distr_type - 2U) {
    pgVar10 = (global_array_t *)0x0;
    pnga_error("Array is not using ScaLAPACK or tiled data distribution",0);
  }
  pgVar5 = GA;
  pgVar1 = GA + lVar25;
  uVar26 = (ulong)pgVar1->ndim;
  uVar16 = 0;
  pgVar14 = GA;
  uVar9 = 0;
  if (0 < (long)uVar26) {
    uVar9 = uVar26;
  }
  for (; pgVar6 = GA, uVar9 != uVar16; uVar16 = uVar16 + 1) {
    pgVar10 = (global_array_t *)index[uVar16];
    if (((long)pgVar10 < 0) || (pgVar5[lVar25].num_blocks[uVar16] <= (long)pgVar10)) {
      pnga_error("block index outside allowed values",(Integer)pgVar10);
    }
  }
  pgVar2 = GA + lVar25;
  iVar3 = GA[lVar25].distr_type;
  if (iVar3 == 2) {
    uVar7 = (uint)pgVar2->ndim;
    uVar16 = 0;
    uVar18 = 0;
    if (0 < (int)uVar7) {
      uVar18 = (ulong)uVar7;
    }
    for (; uVar18 != uVar16; uVar16 = uVar16 + 1) {
      proc_index[uVar16] = index[uVar16] % (long)GA[g_a + 1000].nblock[uVar16];
    }
    pgVar14 = (global_array_t *)proc_index[(long)(int)uVar7 + -1];
    for (uVar8 = uVar7 - 2; -1 < (int)uVar8; uVar8 = uVar8 - 1) {
      pgVar14 = (global_array_t *)((long)pgVar14 * (long)pgVar2->nblock[uVar8] + proc_index[uVar8]);
    }
    proc_index[0] = (long)pgVar14 % (long)pgVar2->nblock[0];
    pgVar10 = pgVar14;
    lVar25 = 0;
    while (lVar25 + 1 < (long)(int)uVar7) {
      pgVar10 = (global_array_t *)
                (((long)pgVar10 - proc_index[0]) / (long)GA[g_a + 1000].nblock[lVar25]);
      proc_index[0] = (long)pgVar10 % (long)GA[g_a + 1000].nblock[lVar25 + 1];
      proc_index[lVar25 + 1] = proc_index[0];
      lVar25 = lVar25 + 1;
    }
    uVar16 = 1;
    if (1 < (long)uVar26) {
      uVar16 = uVar26;
    }
    for (lVar25 = 0; uVar16 * 4 + -4 != lVar25; lVar25 = lVar25 + 4) {
      lVar11 = *(long *)((long)pgVar5[g_a + 1000].block_dims + lVar25 * 2);
      lVar12 = *(int *)((long)pgVar5[g_a + 1000].nblock + lVar25) * lVar11;
      lVar15 = *(long *)((long)pgVar6[g_a + 1000].dims + lVar25 * 2);
      lVar23 = lVar15 % lVar12;
      pgVar10 = (global_array_t *)((lVar15 / lVar12) * lVar11);
      *(global_array_t **)((long)ld + lVar25 * 2) = pgVar10;
      lVar15 = *(long *)((long)pgVar5[g_a + 1000].block_dims + lVar25 * 2);
      lVar12 = *(long *)((long)pgVar5[g_a + 1000].dims + lVar25 * 2);
      if (lVar23 < 1) {
LAB_00169806:
        lVar15 = lVar12 % lVar15;
      }
      else {
        lVar17 = *(long *)((long)proc_index + lVar25 * 2);
        if (lVar23 / lVar11 <= lVar17) {
          lVar12 = lVar23;
          if (lVar17 == lVar23 / lVar11) goto LAB_00169806;
          lVar15 = 0;
        }
      }
      *(long *)((long)ld + lVar25 * 2) = (long)pgVar10->dims + lVar15 + -0x30;
    }
  }
  else if (iVar3 == 4) {
    uVar7 = (uint)pgVar2->ndim;
    uVar16 = 0;
    uVar18 = 0;
    if (0 < (int)uVar7) {
      uVar18 = (ulong)uVar7;
    }
    for (; uVar18 != uVar16; uVar16 = uVar16 + 1) {
      proc_index[uVar16] = index[uVar16] % (long)GA[g_a + 1000].nblock[uVar16];
    }
    pgVar14 = (global_array_t *)proc_index[(long)(int)uVar7 + -1];
    for (uVar8 = uVar7 - 2; -1 < (int)uVar8; uVar8 = uVar8 - 1) {
      pgVar14 = (global_array_t *)((long)pgVar14 * (long)pgVar2->nblock[uVar8] + proc_index[uVar8]);
    }
    proc_index[0] = (long)pgVar14 % (long)pgVar2->nblock[0];
    pgVar10 = pgVar14;
    lVar11 = 0;
    while (lVar11 + 1 < (long)(int)uVar7) {
      pgVar10 = (global_array_t *)
                (((long)pgVar10 - proc_index[0]) / (long)GA[g_a + 1000].nblock[lVar11]);
      proc_index[0] = (long)pgVar10 % (long)GA[g_a + 1000].nblock[lVar11 + 1];
      proc_index[lVar11 + 1] = proc_index[0];
      lVar11 = lVar11 + 1;
    }
    pCVar13 = GA[lVar25].mapc;
    pgVar10 = (global_array_t *)0x0;
    for (uVar16 = 0; uVar16 != uVar9; uVar16 = uVar16 + 1) {
      lld[uVar16] = 0;
      ldidx[uVar16] = 0;
      lVar11 = index[uVar16];
      lVar15 = pgVar5[lVar25].num_blocks[uVar16];
      if (lVar11 < lVar15 + -1) {
        CVar20 = pCVar13[(long)pgVar10->dims + lVar11 + -0x2f] + -1;
      }
      else {
        CVar20 = pgVar5[lVar25].dims[uVar16];
      }
      lVar21 = (CVar20 - pCVar13[(long)pgVar10->dims + lVar11 + -0x30]) + 1;
      ldims[uVar16] = lVar21;
      lVar23 = 0;
      lVar17 = 0;
      for (lVar12 = proc_index[uVar16]; lVar12 < lVar15;
          lVar12 = lVar12 + pgVar5[lVar25].nblock[uVar16]) {
        if (lVar12 < lVar15 + -1) {
          CVar20 = pCVar13[(long)pgVar10->dims + lVar12 + -0x2f] + -1;
        }
        else {
          CVar20 = pgVar5[lVar25].dims[uVar16];
        }
        lVar4 = pCVar13[(long)pgVar10->dims + lVar12 + -0x30];
        lVar17 = lVar17 + (CVar20 - lVar4) + 1;
        lld[uVar16] = lVar17;
        if (lVar12 < lVar11) {
          lVar23 = lVar23 + (CVar20 - lVar4) + 1;
          ldidx[uVar16] = lVar23;
        }
      }
      if ((long)uVar16 < (long)(uVar26 - 1)) {
        ld[uVar16] = lVar21;
        lVar15 = pgVar5[lVar25].num_blocks[uVar16];
      }
      pgVar10 = (global_array_t *)((long)pgVar10->dims + lVar15 + -0x30);
    }
  }
  else if (iVar3 == 3) {
    uVar7 = (uint)pgVar2->ndim;
    uVar16 = 0;
    uVar18 = 0;
    if (0 < (int)uVar7) {
      uVar18 = (ulong)uVar7;
    }
    for (; uVar18 != uVar16; uVar16 = uVar16 + 1) {
      proc_index[uVar16] = index[uVar16] % (long)GA[g_a + 1000].nblock[uVar16];
    }
    pgVar14 = (global_array_t *)proc_index[(long)(int)uVar7 + -1];
    for (uVar8 = uVar7 - 2; -1 < (int)uVar8; uVar8 = uVar8 - 1) {
      pgVar14 = (global_array_t *)((long)pgVar14 * (long)pgVar2->nblock[uVar8] + proc_index[uVar8]);
    }
    proc_index[0] = (long)pgVar14 % (long)pgVar2->nblock[0];
    pgVar10 = pgVar14;
    lVar25 = 0;
    while (lVar25 + 1 < (long)(int)uVar7) {
      pgVar10 = (global_array_t *)
                (((long)pgVar10 - proc_index[0]) / (long)GA[g_a + 1000].nblock[lVar25]);
      proc_index[0] = (long)pgVar10 % (long)GA[g_a + 1000].nblock[lVar25 + 1];
      proc_index[lVar25 + 1] = proc_index[0];
      lVar25 = lVar25 + 1;
    }
    for (uVar16 = 0; uVar9 != uVar16; uVar16 = uVar16 + 1) {
      lVar25 = (index[uVar16] + 1) * pgVar1->block_dims[uVar16];
      if (pgVar1->dims[uVar16] <= lVar25) {
        lVar25 = pgVar1->dims[uVar16];
      }
      pgVar10 = (global_array_t *)(lVar25 - pgVar1->block_dims[uVar16] * index[uVar16]);
      ldims[uVar16] = (Integer)pgVar10;
      if ((long)uVar16 < (long)(uVar26 - 1)) {
        ld[uVar16] = (Integer)pgVar10;
      }
    }
  }
  if (iVar3 == 2) {
    pgVar10 = (global_array_t *)0x0;
    lVar25 = 1;
    for (uVar16 = 0; uVar9 != uVar16; uVar16 = uVar16 + 1) {
      lVar11 = lVar25;
      if ((long)uVar16 < (long)(uVar26 - 1)) {
        lVar11 = ld[uVar16] * lVar25;
      }
      pgVar10 = (global_array_t *)
                ((long)pgVar10->dims +
                ((index[uVar16] - proc_index[uVar16]) / (long)pgVar5[g_a + 1000].nblock[uVar16]) *
                lVar25 * pgVar5[g_a + 1000].block_dims[uVar16] + -0x30);
      lVar25 = lVar11;
    }
  }
  else if (iVar3 == 3) {
    for (lVar25 = 0; uVar9 * 4 - lVar25 != 0; lVar25 = lVar25 + 4) {
      lVar11 = *(long *)((long)proc_index + lVar25 * 2);
      lVar23 = (long)*(int *)((long)pgVar5[g_a + 1000].nblock + lVar25);
      *(long *)((long)block_idx + lVar25 * 2) =
           ((*(long *)((long)index + lVar25 * 2) - lVar11) + 1) / lVar23;
      lVar15 = *(long *)((long)pgVar5[g_a + 1000].block_dims + lVar25 * 2);
      lVar11 = (*(long *)((long)pgVar5[g_a + 1000].num_blocks + lVar25 * 2) - lVar11) + 1;
      lVar12 = lVar11 / lVar23;
      if (lVar11 % lVar23 == 0) {
        lVar11 = *(long *)((long)pgVar5[g_a + 1000].dims + lVar25 * 2) % lVar15;
        lVar12 = lVar12 << 0x20;
        lVar23 = lVar12 >> 0x20;
        if (lVar11 == 0) goto LAB_001699de;
        *(long *)((long)lld + lVar25 * 2) = lVar15 * (lVar12 + -0x100000000 >> 0x20) + lVar11;
      }
      else {
        lVar23 = (long)(int)lVar12;
LAB_001699de:
        *(long *)((long)lld + lVar25 * 2) = lVar15 * lVar23;
      }
      *(long *)((long)block_count + lVar25 * 2) = lVar23;
    }
    pCVar13 = ldims;
    pgVar10 = (global_array_t *)0x0;
    for (uVar16 = 0; uVar16 != uVar9; uVar16 = uVar16 + 1) {
      lVar25 = 1;
      for (uVar18 = 0; pCVar19 = pCVar13, uVar22 = uVar16, uVar16 != uVar18; uVar18 = uVar18 + 1) {
        lVar25 = lVar25 * lld[uVar18];
      }
      for (; uVar26 != uVar22; uVar22 = uVar22 + 1) {
        if ((uVar22 <= uVar16) || (pCVar24 = pCVar19, block_idx[uVar22] != block_count[uVar22] + -1)
           ) {
          pCVar24 = pgVar1->block_dims + uVar22;
        }
        lVar25 = lVar25 * *pCVar24;
        pCVar19 = pCVar19 + 1;
      }
      pgVar10 = (global_array_t *)((long)pgVar10->dims + lVar25 * block_idx[uVar16] + -0x30);
      pCVar13 = pCVar13 + 1;
    }
  }
  else if (iVar3 == 4) {
    pgVar10 = (global_array_t *)0x0;
    uVar16 = 0;
    while (uVar16 != uVar9) {
      lVar25 = 1;
      for (uVar18 = 0; uVar16 != uVar18; uVar18 = uVar18 + 1) {
        lVar25 = lVar25 * lld[uVar18];
      }
      lVar25 = lVar25 * ldidx[uVar16];
      uVar16 = uVar16 + 1;
      for (uVar18 = uVar16; (long)uVar18 < (long)uVar26; uVar18 = uVar18 + 1) {
        lVar25 = lVar25 * ldims[uVar18];
      }
      pgVar10 = (global_array_t *)((long)pgVar10->dims + lVar25 + -0x30);
    }
  }
  *(char **)ptr = pgVar2->ptr[(long)pgVar14] + (long)pgVar2->elemsize * (long)pgVar10;
  return;
}

Assistant:

void pnga_access_block_grid_ptr(Integer g_a, Integer *index, void* ptr, Integer *ld)
            /* g_a: array handle [input]
             * index: subscript of a particular block  [input]
             * ptr: pointer to data in block [output]
             * ld:  array of strides for block data [output]
             */
{
  char *lptr;
  Integer  handle = GA_OFFSET + g_a;
  Integer  i/*, p_handle*/, offset, factor, inode;
  Integer ndim;
  C_Integer *num_blocks, *block_dims;
  int *proc_grid;
  Integer *dims;
  Integer last;
  Integer proc_index[MAXDIM];
  Integer blk_num[MAXDIM], blk_dim[MAXDIM], blk_inc[MAXDIM];
  Integer blk_ld[MAXDIM],hlf_blk[MAXDIM],blk_jinc;
  Integer j, lo, hi;
  Integer lld[MAXDIM], block_idx[MAXDIM], block_count[MAXDIM];
  Integer ldims[MAXDIM], ldidx[MAXDIM];
  Integer *mapc;

  
  /*p_handle = GA[handle].p_handle;*/
  if (GA[handle].distr_type != SCALAPACK && GA[handle].distr_type != TILED &&
      GA[handle].distr_type != TILED_IRREG) {
    pnga_error("Array is not using ScaLAPACK or tiled data distribution",0);
  }
  /* dimensions of processor grid */
  proc_grid = GA[handle].nblock;
  /* number of blocks along each dimension */
  num_blocks = GA[handle].num_blocks;
  /* size of individual blocks */
  block_dims = GA[handle].block_dims;
  dims = GA[handle].dims;
  ndim = GA[handle].ndim;
  for (i=0; i<ndim; i++) {
    if (index[i] < 0 || index[i] >= num_blocks[i])
      pnga_error("block index outside allowed values",index[i]);
  }

  /* Find strides of requested block */
  if (GA[handle].distr_type == TILED) {
    /* find out what processor block is located on */
    gam_find_tile_proc_from_indices(handle, inode, index)

    /* get proc indices of processor that owns block */
    gam_find_tile_proc_indices(handle,inode,proc_index)
      last = ndim-1;

    for (i=0; i<ndim; i++)  {
      lo = index[i]*block_dims[i]+1;
      hi = (index[i]+1)*block_dims[i];
      if (hi > dims[i]) hi = dims[i]; 
      ldims[i] = (hi - lo + 1);
      if (i<last) ld[i] = ldims[i];
    }
  } else if (GA[handle].distr_type == TILED_IRREG) {
    /* find out what processor block is located on */
    gam_find_tile_proc_from_indices(handle, inode, index);

    /* get proc indices of processor that owns block */
    gam_find_tile_proc_indices(handle,inode,proc_index)
      last = ndim-1;

    mapc = GA[handle].mapc;
    offset = 0;
    for (i=0; i<ndim; i++) {
      lld[i] = 0;
      ldidx[i] = 0;
      lo = mapc[offset+index[i]];
      if (index[i] < num_blocks[i]-1) {
        hi = mapc[offset+index[i]+1]-1;
      } else {
        hi = dims[i];
      }
      ldims[i] = hi - lo + 1;
      for (j = proc_index[i]; j<num_blocks[i]; j += proc_grid[i]) {
        lo = mapc[offset+j];
        if (j < num_blocks[i]-1) {
          hi = mapc[offset+j+1]-1;
        } else {
          hi = dims[i];
        }
        lld[i] += (hi-lo+1);
        if (j < index[i]) {
          ldidx[i] += (hi-lo+1);
        }
      }
      if (i<last) ld[i] = ldims[i];
      offset += num_blocks[i];
    }
  } else if (GA[handle].distr_type == SCALAPACK) {
    /* find out what processor block is located on */
    gam_find_proc_from_sl_indices(handle, inode, index);

    /* get proc indices of processor that owns block */
    gam_find_proc_indices(handle,inode,proc_index)
      last = ndim-1;
 
    for (i=0; i<last; i++)  {
      blk_dim[i] = block_dims[i]*proc_grid[i];
      blk_num[i] = GA[handle].dims[i]/blk_dim[i];
      blk_inc[i] = GA[handle].dims[i] - blk_num[i]*blk_dim[i];
      blk_ld[i] = blk_num[i]*block_dims[i];
      hlf_blk[i] = blk_inc[i]/block_dims[i];
      ld[i] = blk_ld[i];
      blk_jinc = dims[i]%block_dims[i];
      if (blk_inc[i] > 0) {
        if (proc_index[i]<hlf_blk[i]) {
          blk_jinc = block_dims[i];
        } else if (proc_index[i] == hlf_blk[i]) {
          blk_jinc = blk_inc[i]%block_dims[i];
          /*
          if (blk_jinc == 0) {
          blk_jinc = block_dims[i];
          }
          */
        } else {
          blk_jinc = 0;
        }
      }
      ld[i] += blk_jinc;
    }
  }

  /* Find the local grid index of block relative to local block grid and
     store result in block_idx.
     Find physical dimensions of locally held data and store in 
     lld and set values in ldim, which is used to evaluate the
     offset for the requested block. */
  if (GA[handle].distr_type == TILED) {
    for (i=0; i<ndim; i++) {
      int ldim;
      /*
      block_idx[i] = 0;
      block_count[i] = 0;
      lld[i] = 0;
      lo = 0;
      hi = -1;
      */
      block_idx[i] = (index[i]-proc_index[i]+1)/proc_grid[i];
      ldim = (num_blocks[i]-proc_index[i]+1)/proc_grid[i];
      if ((num_blocks[i]-proc_index[i]+1)%proc_grid[i] == 0) {
        if (dims[i]%block_dims[i] != 0) {
          lld[i] = (ldim-1)*block_dims[i] + dims[i]%block_dims[i];
        } else {
          lld[i] = ldim*block_dims[i];
        }
      } else {
        lld[i] = ldim *block_dims[i];
      }
      block_count[i] = ldim;
      /*
      for (j=proc_index[i]; j<num_blocks[i]; j += proc_grid[i]) {
        lo = j*block_dims[i] + 1;
        hi = (j+1)*block_dims[i];
        if (hi > dims[i]) hi = dims[i]; 
        lld[i] += (hi - lo + 1);
        if (j<index[i]) block_idx[i]++;
        block_count[i]++;
      }
      */
    }

    /* Evaluate offset for requested block. The algorithm used goes like this:
     *    The contribution from the fastest dimension is
     *      block_idx[0]*block_dims[0]*...*block_dims[ndim-1];
     *    The contribution from the second fastest dimension is
     *      block_idx[1]*lld[0]*block_dims[1]*...*block_dims[ndim-1];
     *    The contribution from the third fastest dimension is
     *      block_idx[2]*lld[0]*lld[1]*block_dims[2]*...*block_dims[ndim-1];
     *    etc.
     *    If block_idx[i] is equal to the total number of blocks contained on that
     *    processor minus 1 (the index is at the edge of the array) and the index
     *    i is greater than the index of the dimension, then instead of using the
     *    block dimension, use the fractional dimension of the edge block (which
     *    may be smaller than the block dimension)
     */
    offset = 0;
    for (i=0; i<ndim; i++) {
      factor = 1;
      for (j=0; j<i; j++) {
        factor *= lld[j];
      }
      for (j=i; j<ndim; j++) {
        if (j > i && block_idx[j] == block_count[j]-1) {
          factor *= ldims[j];
        } else {
          factor *= block_dims[j];
        }
      }
      offset += block_idx[i]*factor;
    }
  } else if (GA[handle].distr_type == TILED_IRREG) {
    /* Evaluate offset for requested block. This algorithm is similar to the
     * algorithm for reqularly tiled data layouts.
     *    The contribution from the fastest dimension is
     *      ldidx[0]*ldims[2]*...*ldims[ndim-1];
     *    The contribution from the second fastest dimension is
     *      lld[0]*ldidx[1]*ldims[2]*...*ldims[ndim-1];
     *    The contribution from the third fastest dimension is
     *      lld[0]*lld[1]*ldidx[2]*ldims[3]*...*ldims[ndim-1];
     *    etc.
     */
    offset = 0;
    for (i=0; i<ndim; i++) {
      factor = 1;
      for (j=0; j<i; j++) {
        factor *= lld[j];
      }
      factor *= ldidx[i];
      for (j=i+1; j<ndim; j++) {
        factor *= ldims[j];
      }
      offset += factor;
    }
  } else if (GA[handle].distr_type == SCALAPACK) {
    /* Evalauate offset for block */
    offset = 0;
    factor = 1;
    for (i = 0; i<ndim; i++) {
      offset += ((index[i]-proc_index[i])/proc_grid[i])*block_dims[i]*factor;
      if (i<ndim-1) factor *= ld[i];
    }
  }

  lptr = GA[handle].ptr[inode]+offset*GA[handle].elemsize;

  *(char**)ptr = lptr; 
}